

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassRegistration
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  bool bVar1;
  long lVar2;
  FieldDescriptor *this_00;
  FieldDescriptor *field;
  long lVar3;
  
  if (0 < *(int *)(desc + 0x7c)) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      if ((*(byte *)(*(long *)(desc + 0x50) + 1 + lVar3) & 8) != 0) {
        field = (FieldDescriptor *)(*(long *)(desc + 0x50) + lVar3);
        this_00 = field;
        bVar1 = anon_unknown_0::IgnoreField(field);
        if (!bVar1) {
          GenerateExtension((Generator *)this_00,options,printer,field);
        }
      }
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x48;
    } while (lVar2 < *(int *)(desc + 0x7c));
  }
  return;
}

Assistant:

void Generator::GenerateClassRegistration(const GeneratorOptions& options,
                                          io::Printer* printer,
                                          const Descriptor* desc) const {
  // Register any extensions defined inside this message type.
  for (int i = 0; i < desc->extension_count(); i++) {
    const FieldDescriptor* extension = desc->extension(i);
    if (ShouldGenerateExtension(extension)) {
      GenerateExtension(options, printer, extension);
    }
  }
}